

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O2

void refresh_opl3_volume(YMF278BChip *chip)

{
  DEVFUNC_WRITE_VOL_LR UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = (chip->fm).setVol;
  if (UNRECOVERED_JUMPTABLE != (DEVFUNC_WRITE_VOL_LR)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              ((chip->fm).chip,vol_tab[mix_level[chip->fm_l] << 2] * 2,
               vol_tab[mix_level[chip->fm_r] << 2] * 2);
    return;
  }
  return;
}

Assistant:

static void refresh_opl3_volume(YMF278BChip* chip)
{
	INT32 volL, volR;
	
	if (chip->fm.setVol == NULL)
		return;
	
	volL = mix_level[chip->fm_l];
	volR = mix_level[chip->fm_r];
	// vol_tab[] uses 0x8000 = 100%
	volL = (vol_tab[volL << TL_SHIFT] * OPL4FM_VOL_BALANCE) >> 7;
	volR = (vol_tab[volR << TL_SHIFT] * OPL4FM_VOL_BALANCE) >> 7;
	chip->fm.setVol(chip->fm.chip, volL, volR);
	
	return;
}